

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Test.cpp
# Opt level: O2

Test * __thiscall CppUnit::Test::findTest(Test *this,string *testName)

{
  bool bVar1;
  Test *pTVar2;
  invalid_argument *this_00;
  undefined1 local_118 [8];
  TestPath path;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  TestPath::TestPath((TestPath *)local_118);
  (*this->_vptr_Test[7])(this,testName,(TestPath *)local_118);
  bVar1 = TestPath::isValid((TestPath *)local_118);
  if (bVar1) {
    pTVar2 = TestPath::getChildTest((TestPath *)local_118);
    TestPath::~TestPath((TestPath *)local_118);
    return pTVar2;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::operator+(&local_60,"No test named <",testName);
  std::operator+(&local_80,&local_60,"> found in test <");
  (*this->_vptr_Test[6])(&local_40,this);
  std::operator+(&local_a0,&local_80,&local_40);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &path.m_tests.super__Deque_base<CppUnit::Test_*,_std::allocator<CppUnit::Test_*>_>.
                  _M_impl.super__Deque_impl_data._M_finish._M_node,&local_a0,">.");
  std::invalid_argument::invalid_argument
            (this_00,(string *)
                     &path.m_tests.
                      super__Deque_base<CppUnit::Test_*,_std::allocator<CppUnit::Test_*>_>._M_impl.
                      super__Deque_impl_data._M_finish._M_node);
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

Test *
Test::findTest( const std::string &testName ) const
{
  TestPath path;
  Test *mutableThis = CPPUNIT_CONST_CAST( Test *, this );
  mutableThis->findTestPath( testName, path );
  if ( !path.isValid() )
    throw std::invalid_argument( "No test named <" + testName + "> found in test <"
                                 + getName() + ">." );
  return path.getChildTest();
}